

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::DeserializePropertyIdArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto,FunctionBody *functionBody)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Type pBVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  
  uVar2 = *(uint *)buffer;
  uVar3 = *(uint *)(buffer + 5);
  uVar14 = (ulong)uVar3;
  bVar1 = buffer[9];
  uVar7 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar7 < (ulong)uVar2 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1220,
                                "(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength()"
                               );
    if (!bVar6) goto LAB_00896bf7;
    *puVar8 = 0;
  }
  uVar10 = (ulong)bVar1;
  pbVar9 = ByteBlock::GetBuffer(deserializeInto);
  uVar11 = (ulong)*(uint *)buffer;
  *(uint *)(pbVar9 + uVar11) = uVar3;
  pbVar9[uVar11 + 4] = bVar1;
  uVar2 = *(uint *)buffer;
  uVar7 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar7 < (ulong)uVar2 + (ulong)(uVar3 + bVar1) * 4 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1224,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar6) {
LAB_00896bf7:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  pbVar9[uVar11 + 5] = buffer[10];
  pbVar9[uVar11 + 6] = buffer[0xb];
  if (0 < (int)uVar3) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar12 = 0;
    do {
      pBVar4 = functionBody->byteCodeCache;
      iVar13 = *(int *)(buffer + uVar12 * 4 + 0xc);
      iVar15 = iVar13 - pBVar4->builtInPropertyCount;
      if (iVar13 != -1 && pBVar4->builtInPropertyCount <= iVar13) {
        if (pBVar4->propertyCount <= iVar15) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar6) goto LAB_00896bf7;
          *puVar8 = 0;
        }
        if (pBVar4->propertyIds[iVar15] == -1) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar6) goto LAB_00896bf7;
          *puVar8 = 0;
        }
        iVar13 = pBVar4->propertyIds[iVar15];
      }
      *(int *)(pbVar9 + uVar12 * 4 + uVar11 + 8) = iVar13;
      uVar12 = uVar12 + 1;
    } while (uVar14 != uVar12);
  }
  if (bVar1 != 0) {
    do {
      iVar13 = (int)uVar14;
      *(undefined4 *)(pbVar9 + (long)iVar13 * 4 + uVar11 + 8) =
           *(undefined4 *)(buffer + (long)iVar13 * 4 + 0xc);
      uVar14 = (ulong)(iVar13 + 1);
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  return buffer + (long)(int)(uVar3 + bVar1) * 4 + 0xc;
}

Assistant:

const byte *
    DeserializePropertyIdArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto, FunctionBody * functionBody)
    {
        auto serialized = (serialization_alignment const Js::SerializedPropertyIdArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxPropIdArray);
#endif
        auto propertyCount = serialized->propertyCount;
        auto extraSlotCount = serialized->extraSlots;

        Assert(serialized->offset + sizeof(PropertyIdArray) <= deserializeInto->GetLength());
        auto result = (PropertyIdArray *)(deserializeInto->GetBuffer() + serialized->offset);
        result->count = propertyCount;
        result->extraSlots = extraSlotCount;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());
        result->hadDuplicates = serialized->hadDuplicates;
        result->has__proto__ = serialized->has__proto__;

        auto elements = (PropertyId*)(serialized + 1);
        for(int i=0;i<propertyCount;++i)
        {
            result->elements[i] = functionBody->GetByteCodeCache()->LookupPropertyId(elements[i]);
        }
        for(int i=0;i<extraSlotCount;++i)
        {
            result->elements[propertyCount + i] = elements[propertyCount + i];
        }
        auto current = buffer +
            sizeof(serialization_alignment const Js::SerializedPropertyIdArray) + (propertyCount + extraSlotCount) * sizeof(PropertyId);
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxPropIdArray);
#endif
        return current;
    }